

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

float pbrt::SobolSampleFloat<pbrt::OwenScrambler>(int64_t a,int dimension,OwenScrambler randomizer)

{
  uint v;
  uint32_t uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  auVar3 = in_ZMM0._0_16_;
  v = 0;
  puVar2 = (uint *)(SobolMatrices32 + (long)(dimension * 0x34) * 4);
  for (; a != 0; a = a >> 1) {
    if ((a & 1U) != 0) {
      v = v ^ *puVar2;
    }
    puVar2 = puVar2 + 1;
  }
  uVar1 = OwenScrambleBinaryFull(v,randomizer.seed);
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar1);
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(auVar3._0_4_ * 2.3283064e-10)));
  return auVar3._0_4_;
}

Assistant:

PBRT_CPU_GPU inline float SobolSampleFloat(int64_t a, int dimension, R randomizer) {
    DCHECK_LT(dimension, NSobolDimensions);
    DCHECK(a >= 0 && a < (1ull << SobolMatrixSize));
    // Compute initial Sobol sample _v_ using generator matrices
    uint32_t v = 0;
    for (int i = dimension * SobolMatrixSize; a != 0; a >>= 1, i++)
        if (a & 1)
            v ^= SobolMatrices32[i];

    v = randomizer(v);
    return std::min(v * 0x1p-32f, FloatOneMinusEpsilon);
}